

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

void Abc_NtkDontCareWinCollectRoots(Odc_Man_t *p)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  Vec_Ptr_t *vRoots;
  int in_EDX;
  int Fill;
  
  pAVar3 = p->pNode;
  pAVar4 = pAVar3->pNtk;
  iVar1 = pAVar3->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((pAVar4->vTravIds).pArray[iVar1] == pAVar3->pNtk->nTravIds) {
    __assert_fail("!Abc_NodeIsTravIdCurrent(p->pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,399,"void Abc_NtkDontCareWinCollectRoots(Odc_Man_t *)");
  }
  pAVar4 = p->pNode->pNtk;
  iVar1 = p->pNode->Id;
  iVar2 = pAVar4->nTravIds;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
  if ((-1 < (long)iVar1) && (iVar1 < (pAVar4->vTravIds).nSize)) {
    (pAVar4->vTravIds).pArray[iVar1] = iVar2;
    vRoots = p->vRoots;
    vRoots->nSize = 0;
    Abc_NtkDontCareWinCollectRoots_rec(p->pNode,vRoots);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Abc_NtkDontCareWinCollectRoots( Odc_Man_t * p )
{
    assert( !Abc_NodeIsTravIdCurrent(p->pNode) );
    // mark the node with the old traversal ID
    Abc_NodeSetTravIdCurrent( p->pNode ); 
    // collect the roots
    Vec_PtrClear( p->vRoots );
    Abc_NtkDontCareWinCollectRoots_rec( p->pNode, p->vRoots );
}